

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shader.cpp
# Opt level: O0

GLuint __thiscall vera::Shader::compileShader(Shader *this,string *_src,GLenum _type,bool _verbose)

{
  undefined4 uVar1;
  GLint GVar2;
  bool bVar3;
  int iVar4;
  istream *piVar5;
  pointer ppVar6;
  size_type sVar7;
  ostream *poVar8;
  reference pvVar9;
  reference pvVar10;
  char *pcVar11;
  bool local_909;
  ulong local_8b8;
  size_t i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lines;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  error_loc2;
  string local_878;
  allocator local_851;
  string local_850;
  string local_830;
  string local_810;
  allocator local_7e9;
  string local_7e8;
  allocator local_7c1;
  string local_7c0;
  string local_7a0;
  undefined1 local_780 [8];
  string error_loc1;
  size_t line_number;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  chuncks;
  undefined1 local_738 [8];
  string error_msg;
  undefined1 local_710 [8];
  vector<char,_std::allocator<char>_> infoLog;
  int local_6f0;
  GLint infoLength;
  GLint isCompiled;
  GLuint shader;
  GLchar *sources [2];
  string local_6d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_690;
  ulong local_670;
  size_t startLine;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_660;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_640;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_620;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_600;
  _Self local_5e0;
  _Self local_5d8;
  DefinesMap_it it;
  istringstream versionIss;
  ulong local_450;
  size_t glslVersionNumber;
  string local_428 [8];
  string dataRead;
  string local_400 [32];
  ostringstream local_3e0 [8];
  ostringstream srcOss;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  undefined1 local_248 [8];
  string srcVersion;
  istringstream srcIss;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  byte local_82;
  bool local_81;
  string local_80 [6];
  bool srcVersionFound;
  bool zeroBasedLineDirective;
  string srcBody;
  allocator local_49;
  string local_48 [8];
  string prolog;
  bool _verbose_local;
  GLenum _type_local;
  string *_src_local;
  Shader *this_local;
  
  prolog.field_2._M_local_buf[0xb] = _verbose;
  prolog.field_2._12_4_ = _type;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,"",&local_49);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  std::__cxx11::string::string(local_80);
  std::__cxx11::string::substr((ulong)&local_a8,(ulong)_src);
  bVar3 = std::operator==(&local_a8,"#version");
  std::__cxx11::string::~string((string *)&local_a8);
  local_82 = bVar3;
  if (bVar3) {
    std::__cxx11::istringstream::istringstream
              ((istringstream *)(srcVersion.field_2._M_local_buf + 8),(string *)_src,_S_in);
    std::__cxx11::string::string((string *)local_248);
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)(srcVersion.field_2._M_local_buf + 8),(string *)local_248);
    std::operator+(&local_268,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_248,
                   '\n');
    std::__cxx11::string::operator+=(local_48,(string *)&local_268);
    std::__cxx11::string::~string((string *)&local_268);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_400,"",(allocator *)(dataRead.field_2._M_local_buf + 0xf));
    std::__cxx11::ostringstream::ostringstream(local_3e0,local_400,_S_out);
    std::__cxx11::string::~string(local_400);
    std::allocator<char>::~allocator((allocator<char> *)(dataRead.field_2._M_local_buf + 0xf));
    std::__cxx11::string::string(local_428);
    while( true ) {
      piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)(srcVersion.field_2._M_local_buf + 8),local_428);
      bVar3 = std::ios::operator_cast_to_bool((ios *)(piVar5 + *(long *)(*(long *)piVar5 + -0x18)));
      if (!bVar3) break;
      poVar8 = std::operator<<((ostream *)local_3e0,local_428);
      std::operator<<(poVar8,'\n');
    }
    std::__cxx11::ostringstream::str();
    std::__cxx11::string::operator=(local_80,(string *)&glslVersionNumber);
    std::__cxx11::string::~string((string *)&glslVersionNumber);
    local_450 = 0;
    std::__cxx11::istringstream::istringstream((istringstream *)&it,(string *)local_248,_S_in);
    std::operator>>((istream *)&it,local_428);
    std::istream::operator>>(&it,&local_450);
    local_909 = 0x6d < local_450 && local_450 < 0x97;
    local_81 = local_909;
    std::__cxx11::istringstream::~istringstream((istringstream *)&it);
    std::__cxx11::string::~string(local_428);
    std::__cxx11::ostringstream::~ostringstream(local_3e0);
    std::__cxx11::string::~string((string *)local_248);
    std::__cxx11::istringstream::~istringstream
              ((istringstream *)(srcVersion.field_2._M_local_buf + 8));
  }
  else {
    std::__cxx11::string::operator=(local_80,(string *)_src);
    local_81 = true;
  }
  if (((this->super_HaveDefines).m_defineChange & 1U) != 0) {
    std::__cxx11::string::operator=((string *)&this->m_defineStack,"");
    local_5d8._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::begin(&(this->super_HaveDefines).m_defines);
    while( true ) {
      local_5e0._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::end(&(this->super_HaveDefines).m_defines);
      bVar3 = std::operator!=(&local_5d8,&local_5e0);
      if (!bVar3) break;
      ppVar6 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator->(&local_5d8);
      std::operator+(&local_660,"#define ",&ppVar6->first);
      std::operator+(&local_640,&local_660," ");
      ppVar6 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator->(&local_5d8);
      std::operator+(&local_620,&local_640,&ppVar6->second);
      std::operator+(&local_600,&local_620,'\n');
      std::__cxx11::string::operator+=((string *)&this->m_defineStack,(string *)&local_600);
      std::__cxx11::string::~string((string *)&local_600);
      std::__cxx11::string::~string((string *)&local_620);
      std::__cxx11::string::~string((string *)&local_640);
      std::__cxx11::string::~string((string *)&local_660);
      startLine = (size_t)std::
                          _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::operator++(&local_5d8,0);
    }
    (this->super_HaveDefines).m_defineChange = false;
  }
  std::__cxx11::string::operator+=(local_48,(string *)&this->m_defineStack);
  local_670 = (ulong)((local_82 & 1) + ((byte)~local_81 & 1));
  std::__cxx11::to_string(&local_6d0,local_670);
  std::operator+(&local_6b0,"#line ",&local_6d0);
  std::operator+(&local_690,&local_6b0,"\n");
  std::__cxx11::string::operator+=(local_48,(string *)&local_690);
  std::__cxx11::string::~string((string *)&local_690);
  std::__cxx11::string::~string((string *)&local_6b0);
  std::__cxx11::string::~string((string *)&local_6d0);
  _isCompiled = std::__cxx11::string::c_str();
  sources[0] = (GLchar *)std::__cxx11::string::c_str();
  infoLength = glCreateShader(prolog.field_2._12_4_);
  glShaderSource(infoLength,2,&isCompiled,0);
  glCompileShader(infoLength);
  glGetShaderiv(infoLength,0x8b81,&local_6f0);
  infoLog.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ = 0;
  glGetShaderiv(infoLength,0x8b84,
                &infoLog.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x14);
  if (1 < (int)infoLog.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_) {
    sVar7 = (size_type)(int)infoLog.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_;
    std::allocator<char>::allocator();
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)local_710,sVar7,
               (allocator_type *)(error_msg.field_2._M_local_buf + 0xf));
    std::allocator<char>::~allocator((allocator<char> *)(error_msg.field_2._M_local_buf + 0xf));
    GVar2 = infoLength;
    uVar1 = infoLog.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_;
    std::vector<char,_std::allocator<char>_>::operator[]
              ((vector<char,_std::allocator<char>_> *)local_710,0);
    glGetShaderInfoLog(GVar2,uVar1,0);
    poVar8 = std::operator<<((ostream *)&std::cerr,"Found ");
    pcVar11 = "error";
    if (local_6f0 != 0) {
      pcVar11 = "warning ";
    }
    poVar8 = std::operator<<(poVar8,pcVar11);
    poVar8 = std::operator<<(poVar8," while compiling ");
    pcVar11 = "vertex";
    if (prolog.field_2._12_4_ == 0x8b30) {
      pcVar11 = "fragment";
    }
    poVar8 = std::operator<<(poVar8,pcVar11);
    poVar8 = std::operator<<(poVar8," shader");
    std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    pvVar9 = std::vector<char,_std::allocator<char>_>::operator[]
                       ((vector<char,_std::allocator<char>_> *)local_710,0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)local_738,pvVar9,
               (allocator *)
               ((long)&chuncks.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&chuncks.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    poVar8 = std::operator<<((ostream *)&std::cerr,(string *)local_738);
    std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)&line_number,(string *)local_738,' ',false);
    error_loc1.field_2._8_8_ = 0;
    pvVar10 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&line_number,0);
    std::__cxx11::string::string((string *)&local_7a0,(string *)pvVar10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_7c0,"(",&local_7c1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_7e8,":",&local_7e9);
    replaceAll((string *)local_780,&local_7a0,&local_7c0,&local_7e8);
    std::__cxx11::string::~string((string *)&local_7e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_7e9);
    std::__cxx11::string::~string((string *)&local_7c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_7c1);
    std::__cxx11::string::~string((string *)&local_7a0);
    std::__cxx11::string::string((string *)&local_830,(string *)local_780);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_850,")",&local_851);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_878,":",
               (allocator *)
               ((long)&error_loc2.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    replaceAll(&local_810,&local_830,&local_850,&local_878);
    std::__cxx11::string::operator=((string *)local_780,(string *)&local_810);
    std::__cxx11::string::~string((string *)&local_810);
    std::__cxx11::string::~string((string *)&local_878);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&error_loc2.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    std::__cxx11::string::~string((string *)&local_850);
    std::allocator<char>::~allocator((allocator<char> *)&local_851);
    std::__cxx11::string::~string((string *)&local_830);
    split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)&lines.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)local_780,':',false);
    pvVar10 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&lines.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,1);
    bVar3 = isInt(pvVar10);
    if (bVar3) {
      pvVar10 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&lines.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,1);
      iVar4 = toInt(pvVar10);
      error_loc1.field_2._8_8_ = SEXT48(iVar4);
    }
    if (1 < (ulong)error_loc1.field_2._8_8_) {
      error_loc1.field_2._8_8_ = error_loc1.field_2._8_8_ + -2;
      split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&i,_src,'\n',true);
      for (local_8b8 = error_loc1.field_2._8_8_;
          sVar7 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&i), local_8b8 < sVar7 && local_8b8 < error_loc1.field_2._8_8_ + 3;
          local_8b8 = local_8b8 + 1) {
        poVar8 = (ostream *)std::ostream::operator<<(&std::cerr,local_8b8 + 1);
        poVar8 = std::operator<<(poVar8," ");
        pvVar10 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&i,local_8b8);
        poVar8 = std::operator<<(poVar8,(string *)pvVar10);
        std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&i);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&lines.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string((string *)local_780);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&line_number);
    std::__cxx11::string::~string((string *)local_738);
    std::vector<char,_std::allocator<char>_>::~vector
              ((vector<char,_std::allocator<char>_> *)local_710);
  }
  if (local_6f0 == 0) {
    glDeleteShader(infoLength);
    this_local._4_4_ = 0;
  }
  else {
    this_local._4_4_ = infoLength;
  }
  std::__cxx11::string::~string(local_80);
  std::__cxx11::string::~string(local_48);
  return this_local._4_4_;
}

Assistant:

GLuint Shader::compileShader(const std::string& _src, GLenum _type, bool _verbose) {
    std::string prolog = "";

    //
    // detect #version directive at the beginning of the shader, move it to the prolog and remove it from the shader
    //

    std::string srcBody; // _src stripped of any #version directive at the beginning
    bool zeroBasedLineDirective; // true for GLSL core 1.10 to 1.50
    bool srcVersionFound = _src.substr(0, 8) == "#version"; // true if user provided a #version directive at the beginning of _src

    if (srcVersionFound) {
        //
        // split _src into srcVersion and srcBody
        //

        std::istringstream srcIss(_src);

        // the version line can be read without checking the result of getline(), srcVersionFound == true implies this
        std::string srcVersion;
        std::getline(srcIss,srcVersion);

        // move the #version directive to the top of the prolog
        prolog += srcVersion + '\n';

        // copy the rest of the shader into srcBody
        std::ostringstream srcOss("");
        std::string dataRead;
        while (std::getline(srcIss,dataRead)) {
            srcOss << dataRead << '\n';
        }
        srcBody = srcOss.str();

        //
        // try to determine which version are we actually using
        //

        size_t glslVersionNumber = 0;
        std::istringstream versionIss(srcVersion);
        versionIss >> dataRead; // consume the "#version" string which is guaranteed to be there
        versionIss >> glslVersionNumber; // try to read the next token and convert it to a number

        //
        // determine if the glsl version number starts numbering the #line directive from 0 or from 1
        //
        // #version 100        : "es"   profile, numbering starts from 1
        // #version 110 to 150 : "core" profile, numbering starts from 0
        // #version 200        : "es"   profile, numbering starts from 1
        // #version 300 to 320 : "es"   profile, numbering starts from 1
        // #version 330+       : all           , numbering starts from 1
        //
        // Any malformed or invalid #version directives are of no interest here, the shader compiler
        // will take care of reporting this to the user later.
        //

        zeroBasedLineDirective = (glslVersionNumber >= 110 && glslVersionNumber <= 150);

    } else {
        // no #version directive found at the beginning of _src, which means...
        srcBody = _src; // ... _src contains the whole shader body and ...
        zeroBasedLineDirective = true; // ... glsl defaults to version 1.10, which starts numbering #line directives from 0.
    }

    // Only update the define stack string when it change
    if (m_defineChange) {
        m_defineStack = "";
        for (DefinesMap_it it = m_defines.begin(); it != m_defines.end(); it++)
            m_defineStack += "#define " + it->first + " " + it->second + '\n';
        m_defineChange = false;
    }
    prolog += m_defineStack;

    //
    // determine the #line offset to be used for conciliating lines in glsl error messages and the line number in the editor
    //
    // #line 0 : no version specified by user, glsl defaults to version 1.10, shader source used without modifications
    // #line 1 : user specified #version 1.10 to 1.50, which start numbering #line from 0, version line removed from _src
    // #line 2 : user specified a version #version other than 1.10 to 1.50, those start numbering #line from 1, version line removed from _src
    //

    size_t startLine = (srcVersionFound ? 1 : 0) + (zeroBasedLineDirective ? 0 : 1);
    prolog += "#line " + std::to_string(startLine) + "\n";

    // if (_verbose) {
    //     if (_type == GL_VERTEX_SHADER) {
    //         std::cout << "// ---------- Vertex Shader" << std::endl;
    //     }
    //     else {
    //         std::cout << "// ---------- Fragment Shader" << std::endl;
    //     }
    //     std::cout << prolog << std::endl;
    //     std::cout << srcBody << std::endl;
    // }

    const GLchar* sources[2] = {
        (const GLchar*) prolog.c_str(),
        (const GLchar*) srcBody.c_str()
    };

    GLuint shader = glCreateShader(_type);
    glShaderSource(shader, 2, sources, NULL);
    glCompileShader(shader);

    GLint isCompiled;
    glGetShaderiv(shader, GL_COMPILE_STATUS, &isCompiled);

    GLint infoLength = 0;
    glGetShaderiv(shader, GL_INFO_LOG_LENGTH, &infoLength);

#if defined(PLATFORM_RPI) || defined(__EMSCRIPTEN__)
    if (infoLength > 1 && !isCompiled) {
#else
    if (infoLength > 1) {
#endif
        std::vector<GLchar> infoLog(infoLength);
        glGetShaderInfoLog(shader, infoLength, NULL, &infoLog[0]);
        std::cerr << "Found " << (isCompiled ? "warning " : "error") << " while compiling " << ((_type == GL_FRAGMENT_SHADER)? "fragment" : "vertex") << " shader" << std::endl;
        std::string error_msg = &infoLog[0];
        std::cerr << error_msg << std::endl;

        std::vector<std::string> chuncks = vera::split(error_msg, ' ');
        size_t line_number = 0;

#if defined(__APPLE__)
    // Error Message on Apple M1
        // ERROR: 0:41: 'color' : syntax error: syntax error

        std::vector<std::string> error_loc = vera::split(chuncks[1], ':');
        if (vera::isInt(error_loc[1]))
            line_number = vera::toInt(error_loc[1]);

#elif defined(_WIN32)

#elif defined(__EMSCRIPTEN__)

#else
    // Linux ARM
        // 0:41(2): error: syntax error, unexpected IDENTIFIER, expecting ',' or ';'

    // Linux iX86
        // Error Message on Mesa Intel(R) Iris(R) Plus Graohics (ICL GT2)
        // 0:41(2): error: syntax error, unexpected IDENTIFIER, expecting ',' or ';'

        // Error Message on NVdia GeForce GTX 1650
        // 0(41) : error C0000: syntax error, unexpected '.', expecting "::" at token "."

        std::string error_loc1 = vera::replaceAll(chuncks[0], "(", ":");
        error_loc1 = vera::replaceAll(error_loc1, ")", ":");
        std::vector<std::string> error_loc2 = vera::split(error_loc1, ':');
        if (vera::isInt(error_loc2[1]))
            line_number = vera::toInt(error_loc2[1]);

#endif

        // Print line (-/+ lines for context)
        if (line_number > 1) {
            line_number -= 2;
            std::vector<std::string> lines = vera::split(_src, '\n', true);
            for (size_t i = line_number; i < lines.size() && i < line_number + 3; i++)
                std::cerr << i + 1 << " " << lines[i] << std::endl;
        }

    }

    if (isCompiled == GL_FALSE) {
        glDeleteShader(shader);
        return 0;
    }

    return shader;
}

void Shader::detach(GLenum _type) {
#ifndef __EMSCRIPTEN__
    bool vert = (GL_VERTEX_SHADER & _type) == GL_VERTEX_SHADER;
    bool frag = (GL_FRAGMENT_SHADER & _type) == GL_FRAGMENT_SHADER;

    if (vert) {
        glDeleteShader(m_vertexShader);
        glDetachShader(m_vertexShader, GL_VERTEX_SHADER);
    }

    if (frag) {
        glDeleteShader(m_fragmentShader);
        glDetachShader(m_fragmentShader, GL_FRAGMENT_SHADER);
    }
#endif
}

GLint Shader::getUniformLocation(const std::string& _uniformName) const {
    GLint loc = glGetUniformLocation(m_program, _uniformName.c_str());
    if (loc == -1){
        // std::cerr << "Uniform " << _uniformName << " not found" << std::endl;
    }
    return loc;
}

void Shader::setUniform(const std::string& _name, int _x) {
    if (inUse()) {
        glUniform1i(getUniformLocation(_name), _x);
    }
}

void Shader::setUniform(const std::string& _name, int _x, int _y) {
    if (inUse()) {
        glUniform2i(getUniformLocation(_name), _x, _y);
        // std::cout << "Uniform " << _name << ": vec2i(" << _x << "," << _y << ")" << std::endl;
    }
}

void Shader::setUniform(const std::string& _name, int _x, int _y, int _z) {
    if (inUse()) {
        glUniform3i(getUniformLocation(_name), _x, _y, _z);
        // std::cout << "Uniform " << _name << ": vec3i(" << _x << "," << _y << "," << _z <<")" << std::endl;
    }
}

void Shader::setUniform(const std::string& _name, int _x, int _y, int _z, int _w) {
    if (inUse()) {
        glUniform4i(getUniformLocation(_name), _x, _y, _z, _w);
        // std::cout << "Uniform " << _name << ": vec4i(" << _x << "," << _y << "," << _z << << "," << _w << ")" << std::endl;
    }
}

void Shader::setUniform(const std::string& _name, const int *_array, size_t _size) {
    GLint loc = getUniformLocation(_name);
    if (inUse()) {
        if (_size == 1) {
            glUniform1i(loc, _array[0]);
        }
        else if (_size == 2) {
            glUniform2i(loc, _array[0], _array[1]);
            std::cout << _name << ',' << _array[0] << ',' << _array[1] << std::endl;
        }
        else if (_size == 3) {
            glUniform3i(loc, _array[0], _array[1], _array[2]);
        }
        else if (_size == 4) {
            glUniform4i(loc, _array[0], _array[1], _array[2], _array[3]);
        }
        else {
            std::cerr << "Passing matrix uniform as array, not supported yet" << std::endl;
        }
    }
}

void Shader::setUniform(const std::string& _name, float _x) {
    if (inUse()) {
        glUniform1f(getUniformLocation(_name), _x);
        // std::cout << "Uniform " << _name << ": float(" << _x << ")" << std::endl;
    }
}

void Shader::setUniform(const std::string& _name, float _x, float _y) {
    if (inUse()) {
        glUniform2f(getUniformLocation(_name), _x, _y);
        // std::cout << "Uniform " << _name << ": vec2(" << _x << "," << _y << ")" << std::endl;
    }
}

void Shader::setUniform(const std::string& _name, float _x, float _y, float _z) {
    if (inUse()) {
        glUniform3f(getUniformLocation(_name), _x, _y, _z);
        // std::cout << "Uniform " << _name << ": vec3(" << _x << "," << _y << "," << _z <<")" << std::endl;
    }
}

void Shader::setUniform(const std::string& _name, float _x, float _y, float _z, float _w) {
    if (inUse()) {
        glUniform4f(getUniformLocation(_name), _x, _y, _z, _w);
        // std::cout << "Uniform " << _name << ": vec3(" << _x << "," << _y << "," << _z <<")" << std::endl;
    }
}

void Shader::setUniform(const std::string& _name, const float *_array, size_t _size) {
    GLint loc = getUniformLocation(_name);
    if (inUse()) {
        if (_size == 1) {
            glUniform1f(loc, _array[0]);
        }
        else if (_size == 2) {
            glUniform2f(loc, _array[0], _array[1]);
        }
        else if (_size == 3) {
            glUniform3f(loc, _array[0], _array[1], _array[2]);
        }
        else if (_size == 4) {
            glUniform4f(loc, _array[0], _array[1], _array[2], _array[2]);
        }
        else {
            std::cerr << "Passing matrix uniform as array, not supported yet" << std::endl;
        }
    }
}

void Shader::setUniform(const std::string& _name, const glm::vec2 *_array, size_t _size) {
    if (inUse()) {
        glUniform2fv(getUniformLocation(_name), _size, glm::value_ptr(_array[0]));
    }
}

void Shader::setUniform(const std::string& _name, const glm::vec3 *_array, size_t _size) {
    if (inUse()) {
        glUniform3fv(getUniformLocation(_name), _size, glm::value_ptr(_array[0]));
    }
}

void Shader::setUniform(const std::string& _name, const glm::vec4 *_array, size_t _size) {
    if (inUse()) {
        glUniform4fv(getUniformLocation(_name), _size, glm::value_ptr(_array[0]));
    }
}

void Shader::setUniformTexture(const std::string& _name, GLuint _textureId, size_t _texLoc) {
    if (inUse()) {
        glActiveTexture(GL_TEXTURE0 + _texLoc);
        glBindTexture(GL_TEXTURE_2D, _textureId);
        glUniform1i(getUniformLocation(_name), _texLoc);
    }
}

void Shader::setUniformTexture(const std::string& _name, const Texture* _tex, size_t _texLoc) {
    setUniformTexture(_name, _tex->getTextureId(), _texLoc);
}

void Shader::setUniformTexture(const std::string& _name, const Fbo* _fbo, size_t _texLoc) {
    setUniformTexture(_name, _fbo->getTextureId(), _texLoc);
}

void Shader::setUniformDepthTexture(const std::string& _name, const Fbo* _fbo, size_t _texLoc) {
    setUniformTexture(_name, _fbo->getDepthTextureId(), _texLoc);
}

void Shader::setUniformTexture(const std::string& _name, const Texture* _tex) {
    setUniformTexture(_name, _tex->getTextureId(), textureIndex++);
}

void  Shader::setUniformTexture(const std::string& _name, const Fbo* _fbo) {
    setUniformTexture(_name, _fbo->getTextureId(), textureIndex++);
}

void  Shader::setUniformDepthTexture(const std::string& _name, const Fbo* _fbo) {
    setUniformTexture(_name, _fbo->getDepthTextureId(), textureIndex++);
}

void Shader::setUniformTextureCube(const std::string& _name, const TextureCube* _tex, size_t _texLoc) {
    if (inUse()) {
        glActiveTexture(GL_TEXTURE0 + _texLoc);
        glBindTexture(GL_TEXTURE_CUBE_MAP, _tex->getTextureId());
        glUniform1i(getUniformLocation(_name), _texLoc);
    }
}

void  Shader::setUniformTextureCube(const std::string& _name, const TextureCube* _tex) {
    setUniformTextureCube(_name, _tex, textureIndex++);
}

void Shader::setUniform(const std::string& _name, const glm::mat2& _value, bool _transpose) {
    if (inUse()) {
        glUniformMatrix2fv(getUniformLocation(_name), 1, _transpose, &_value[0][0]);
    }
}

void Shader::setUniform(const std::string& _name, const glm::mat3& _value, bool _transpose) {
    if (inUse()) {
        glUniformMatrix3fv(getUniformLocation(_name), 1, _transpose, &_value[0][0]);
    }
}

void Shader::setUniform(const std::string& _name, const glm::mat4& _value, bool _transpose) {
    if (inUse()) {
        glUniformMatrix4fv(getUniformLocation(_name), 1, _transpose, &_value[0][0]);
    }
}

}